

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

QCborArray __thiscall QCborValue::toArray(QCborValue *this)

{
  QCborArray *in_RSI;
  QExplicitlySharedDataPointer<QCborContainerPrivate> in_RDI;
  long in_FS_OFFSET;
  QCborValue *this_00;
  QCborContainerPrivate *local_8;
  
  local_8 = *(QCborContainerPrivate **)(in_FS_OFFSET + 0x28);
  this_00 = (QCborValue *)&stack0xfffffffffffffff0;
  QCborArray::QCborArray((QCborArray *)0x470a56);
  toArray(this_00,in_RSI);
  QCborArray::~QCborArray((QCborArray *)0x470a76);
  if (*(QCborContainerPrivate **)(in_FS_OFFSET + 0x28) == local_8) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QCborArray QCborValue::toArray() const
{
    return toArray(QCborArray());
}